

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O2

char * xmlMemoryStrdup(char *str)

{
  ulong __n;
  size_t sVar1;
  undefined4 *puVar2;
  char *pcVar3;
  
  sVar1 = strlen(str);
  __n = sVar1 + 1;
  xmlInitParser();
  if (__n < 0xfffffffffffffff0) {
    puVar2 = (undefined4 *)malloc(sVar1 + 0x11);
    if (puVar2 != (undefined4 *)0x0) {
      *puVar2 = 0x5aa5;
      *(ulong *)(puVar2 + 2) = __n;
      xmlMutexLock(&xmlMemMutex);
      debugMemSize = debugMemSize + __n;
      debugMemBlocks = debugMemBlocks + 1;
      xmlMutexUnlock(&xmlMemMutex);
      pcVar3 = (char *)memcpy(puVar2 + 4,str,__n);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
xmlMemoryStrdup(const char *str) {
    char *s;
    size_t size = strlen(str) + 1;
    MEMHDR *p;

    xmlInitParser();

    if (size > (MAX_SIZE_T - RESERVE_SIZE))
        return(NULL);

    p = (MEMHDR *) malloc(RESERVE_SIZE + size);
    if (!p)
        return(NULL);
    p->mh_tag = MEMTAG;
    p->mh_size = size;

    xmlMutexLock(&xmlMemMutex);
    debugMemSize += size;
    debugMemBlocks++;
    xmlMutexUnlock(&xmlMemMutex);

    s = (char *) HDR_2_CLIENT(p);

    memcpy(s, str, size);

    return(s);
}